

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatPath.cpp
# Opt level: O0

string * __thiscall FatPath::getBasename_abi_cxx11_(string *__return_storage_ptr__,FatPath *this)

{
  size_type sVar1;
  reference pvVar2;
  FatPath *this_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->parts);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&this->parts,sVar1 - 1);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
  return __return_storage_ptr__;
}

Assistant:

string FatPath::getBasename()
{
    return parts[parts.size()-1];
}